

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O1

JavascriptMethod NativeCodeGenerator::CheckCodeGen(ScriptFunction *function)

{
  uint uVar1;
  NativeCodeGenerator *manager;
  bool bVar2;
  ExecutionMode EVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptMethod p_Var6;
  FunctionBody *this;
  ScriptContext *this_00;
  code *pcVar7;
  FunctionEntryPointInfo *pFVar8;
  FunctionEntryPointInfo *entryPointInfo;
  JobProcessor *pJVar9;
  ProxyEntryPointInfo *pPVar10;
  ProxyEntryPointInfo *pPVar11;
  
  if (function == (ScriptFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x64f,"(function)","function");
    if (!bVar2) goto LAB_006007c8;
    *puVar5 = 0;
  }
  p_Var6 = Js::RecyclableObject::GetEntryPoint((RecyclableObject *)function);
  if (p_Var6 != CheckCodeGenThunk) {
    p_Var6 = Js::RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    bVar2 = Js::CrossSite::IsThunk(p_Var6);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                         ,0x651,
                         "(function->GetEntryPoint() == NativeCodeGenerator::CheckCodeGenThunk || Js::CrossSite::IsThunk(function->GetEntryPoint()))"
                         ,
                         "function->GetEntryPoint() == NativeCodeGenerator::CheckCodeGenThunk || Js::CrossSite::IsThunk(function->GetEntryPoint())"
                        );
      if (!bVar2) goto LAB_006007c8;
      *puVar5 = 0;
    }
  }
  this = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  this_00 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this);
  manager = this_00->nativeCodeGen;
  if (this_00->threadContext->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x657,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "scriptContext->GetThreadContext()->IsScriptActive()");
    if (!bVar2) goto LAB_006007c8;
    *puVar5 = 0;
  }
  if (this_00->threadContext->callRootLevel == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x658,"(scriptContext->GetThreadContext()->IsInScript())",
                       "scriptContext->GetThreadContext()->IsInScript()");
    if (!bVar2) goto LAB_006007c8;
    *puVar5 = 0;
  }
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4d5,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_006007c8;
    *puVar5 = 0;
  }
  if ((FunctionBody *)
      (((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionBodyImpl)
      .ptr != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4d6,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                       "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) goto LAB_006007c8;
    *puVar5 = 0;
  }
  pcVar7 = Js::FunctionInfo::GetOriginalEntryPoint
                     ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr);
  pFVar8 = Js::ScriptFunction::GetFunctionEntryPointInfo(function);
  entryPointInfo = Js::FunctionBody::GetDefaultFunctionEntryPointInfo(this);
  if (pFVar8 != entryPointInfo) {
    p_Var6 = Js::FunctionProxy::GetDirectEntryPoint
                       ((FunctionProxy *)this,(ProxyEntryPointInfo *)entryPointInfo);
    Js::ScriptFunction::UpdateThunkEntryPoint(function,entryPointInfo,p_Var6);
    p_Var6 = Js::FunctionProxy::GetDirectEntryPoint
                       ((FunctionProxy *)this,(ProxyEntryPointInfo *)entryPointInfo);
    pFVar8 = entryPointInfo;
    if (p_Var6 != CheckCodeGenThunk) {
      return p_Var6;
    }
  }
  if (((DAT_015bbe38 == '\x01') &&
      (EVar3 = Js::FunctionBody::GetExecutionMode(this), EVar3 != SimpleJit)) &&
     (bVar2 = Js::FunctionBody::TryTransitionToJitExecutionMode(this), bVar2)) {
    pJVar9 = JsUtil::JobManager::Processor((JobManager *)manager);
    JsUtil::JobProcessor::PrioritizeJobAndWait<NativeCodeGenerator,Js::FunctionEntryPointInfo*>
              (pJVar9,manager,pFVar8,function);
LAB_00600696:
    p_Var6 = CheckCodeGenDone(this,pFVar8,function);
    return p_Var6;
  }
  pJVar9 = JsUtil::JobManager::Processor((JobManager *)manager);
  bVar2 = JsUtil::JobProcessor::PrioritizeJob<NativeCodeGenerator,Js::FunctionEntryPointInfo*>
                    (pJVar9,manager,pFVar8,function);
  if (bVar2) goto LAB_00600696;
  pPVar10 = Js::FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
  pPVar11 = Js::ScriptFunction::GetEntryPointInfo(function);
  if (pPVar10 == pPVar11) {
    if (((pcVar7 == Js::InterpreterStackFrame::StaticInterpreterThunk ||
          pcVar7 == Js::InterpreterStackFrame::DelayDynamicInterpreterThunk) ||
        (BVar4 = Js::ScriptContext::IsDynamicInterpreterThunk(this_00,pcVar7),
        pcVar7 == Js::JavascriptFunction::DeferredParsingThunk)) ||
       ((pcVar7 == Js::ScriptContext::ProfileModeDeferredParsingThunk || (BVar4 != 0))))
    goto LAB_0060075a;
    pFVar8 = Js::FunctionBody::GetSimpleJitEntryPointInfo(this);
    if (pFVar8 != (FunctionEntryPointInfo *)0x0) {
      pFVar8 = Js::FunctionBody::GetSimpleJitEntryPointInfo(this);
      p_Var6 = Js::EntryPointInfo::GetNativeEntrypoint(&pFVar8->super_EntryPointInfo);
      if (pcVar7 == p_Var6) goto LAB_0060075a;
    }
  }
  pFVar8 = Js::FunctionBody::GetDefaultFunctionEntryPointInfo(this);
  uVar1 = pFVar8->entryPointIndex;
  pFVar8 = Js::ScriptFunction::GetFunctionEntryPointInfo(function);
  if (uVar1 <= pFVar8->entryPointIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x68f,
                       "(functionBody->GetDefaultEntryPointInfo() == function->GetEntryPointInfo() && ( originalEntryPoint == Js::InterpreterStackFrame::DelayDynamicInterpreterThunk || originalEntryPoint == Js::InterpreterStackFrame::StaticInterpreterThunk || scriptContext->IsDynamicInterpreterThunk(originalEntryPoint) || (originalEntryPoint == Js::ScriptContext::ProfileModeDeferredParsingThunk) || originalEntryPoint == Js::JavascriptFunction::DeferredParsingThunk || ( functionBody->GetSimpleJitEntryPointInfo() && originalEntryPoint == functionBody->GetSimpleJitEntryPointInfo()->GetNativeEntrypoint() ) ) || functionBody->GetDefaultFunctionEntryPointInfo()->entryPointIndex > function->GetFunctionEntryPointInfo()->entryPointIndex)"
                       ,
                       "functionBody->GetDefaultEntryPointInfo() == function->GetEntryPointInfo() && ( originalEntryPoint == DefaultEntryThunk || originalEntryPoint == Js::InterpreterStackFrame::StaticInterpreterThunk || scriptContext->IsDynamicInterpreterThunk(originalEntryPoint) || originalEntryPoint_IS_ProfileDeferredParsingThunk || originalEntryPoint == DefaultDeferredParsingThunk || ( functionBody->GetSimpleJitEntryPointInfo() && originalEntryPoint == functionBody->GetSimpleJitEntryPointInfo()->GetNativeEntrypoint() ) ) || functionBody->GetDefaultFunctionEntryPointInfo()->entryPointIndex > function->GetFunctionEntryPointInfo()->entryPointIndex"
                      );
    if (!bVar2) {
LAB_006007c8:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar5 = 0;
  }
LAB_0060075a:
  if (this_00->CurrentThunk == Js::ScriptContext::DebugProfileProbeThunk) {
    pcVar7 = Js::ScriptContext::DebugProfileProbeThunk;
  }
  return pcVar7;
}

Assistant:

Js::JavascriptMethod
NativeCodeGenerator::CheckCodeGen(Js::ScriptFunction * function)
{
    Assert(function);
    Assert(function->GetEntryPoint() == NativeCodeGenerator::CheckCodeGenThunk
        || Js::CrossSite::IsThunk(function->GetEntryPoint()));
    // We are not expecting non-deserialized functions here; Error if it hasn't been deserialized by this point
    Js::FunctionBody *functionBody = function->GetFunctionBody();
    Js::ScriptContext *scriptContext = functionBody->GetScriptContext();

    NativeCodeGenerator *nativeCodeGen = scriptContext->GetNativeCodeGenerator();
    Assert(scriptContext->GetThreadContext()->IsScriptActive());
    Assert(scriptContext->GetThreadContext()->IsInScript());

    // Load the entry point here to validate it got changed afterwards
    Js::JavascriptMethod originalEntryPoint = functionBody->GetOriginalEntryPoint();
    Js::FunctionEntryPointInfo* entryPoint = function->GetFunctionEntryPointInfo();

    Js::FunctionEntryPointInfo *const defaultEntryPointInfo = functionBody->GetDefaultFunctionEntryPointInfo();
    if(entryPoint != defaultEntryPointInfo)
    {
        // Switch to the latest entry point info
        function->UpdateThunkEntryPoint(defaultEntryPointInfo, functionBody->GetDirectEntryPoint(defaultEntryPointInfo));

        const Js::JavascriptMethod defaultDirectEntryPoint = functionBody->GetDirectEntryPoint(defaultEntryPointInfo);
        if(!IsThunk(defaultDirectEntryPoint))
        {
            return defaultDirectEntryPoint;
        }
        entryPoint = defaultEntryPointInfo;
    }

    // If a transition to JIT needs to be forced, JIT right away
    if(Js::Configuration::Global.flags.EnforceExecutionModeLimits &&
        functionBody->GetExecutionMode() != ExecutionMode::SimpleJit &&
        functionBody->TryTransitionToJitExecutionMode())
    {
        nativeCodeGen->Processor()->PrioritizeJobAndWait(nativeCodeGen, entryPoint, function);
        return CheckCodeGenDone(functionBody, entryPoint, function);
    }

    if(!nativeCodeGen->Processor()->PrioritizeJob(nativeCodeGen, entryPoint, function))
    {
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
#define originalEntryPoint_IS_ProfileDeferredParsingThunk \
            (originalEntryPoint == ProfileDeferredParsingThunk)
#else
#define originalEntryPoint_IS_ProfileDeferredParsingThunk \
            false
#endif
        // Job was not yet processed
        // originalEntryPoint is the last known good entry point for the function body. Here we verify that
        // it either corresponds with this codegen episode (identified by function->entryPointIndex) of the function body
        // or one that was scheduled after. In the latter case originalEntryPoint will get updated if and when
        // that last episode completes successfully.
        Assert(functionBody->GetDefaultEntryPointInfo() == function->GetEntryPointInfo() &&
            (
                originalEntryPoint == DefaultEntryThunk
             || originalEntryPoint == Js::InterpreterStackFrame::StaticInterpreterThunk
             || scriptContext->IsDynamicInterpreterThunk(originalEntryPoint)
             || originalEntryPoint_IS_ProfileDeferredParsingThunk
             || originalEntryPoint == DefaultDeferredParsingThunk
             || (
                    functionBody->GetSimpleJitEntryPointInfo() &&
                    originalEntryPoint == functionBody->GetSimpleJitEntryPointInfo()->GetNativeEntrypoint()
                )
            ) ||
            functionBody->GetDefaultFunctionEntryPointInfo()->entryPointIndex > function->GetFunctionEntryPointInfo()->entryPointIndex);
        return (scriptContext->CurrentThunk == ProfileEntryThunk) ? ProfileEntryThunk : originalEntryPoint;
    }

    return CheckCodeGenDone(functionBody, entryPoint, function);
}